

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AssertionResult::AssertionResult(AssertionResult *this,AssertionResult *param_1)

{
  AssertionResult *param_1_local;
  AssertionResult *this_local;
  
  AssertionInfo::AssertionInfo(&this->m_info,&param_1->m_info);
  AssertionResultData::AssertionResultData(&this->m_resultData,&param_1->m_resultData);
  return;
}

Assistant:

AssertionResult( AssertionResult const& )              = default;